

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamStandardIndex::SaveLinearOffsetEntry
          (BamStandardIndex *this,BaiLinearOffsetVector *offsets,int *alignmentStartPosition,
          int *alignmentStopPosition,uint64_t *lastOffset)

{
  value_type vVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RCX;
  int *in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  value_type *in_R8;
  int i;
  int newSize;
  int oldSize;
  int endOffset;
  int beginOffset;
  int local_44;
  
  local_44 = *in_RDX >> 0xe;
  iVar2 = *(int *)&(in_RCX->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start + -1 >> 0xe;
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
  if ((int)sVar3 < iVar2 + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (in_RCX,(size_type)in_R8,(value_type_conflict2 *)CONCAT44(local_44,iVar2));
  }
  while (local_44 = local_44 + 1, local_44 <= iVar2) {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RSI,(long)local_44);
    if (*pvVar4 == 0) {
      vVar1 = *in_R8;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RSI,(long)local_44);
      *pvVar4 = vVar1;
    }
  }
  return;
}

Assistant:

void BamStandardIndex::SaveLinearOffsetEntry(BaiLinearOffsetVector& offsets,
                                             const int& alignmentStartPosition,
                                             const int& alignmentStopPosition,
                                             const uint64_t& lastOffset)
{
    // get converted offsets
    const int beginOffset = alignmentStartPosition >> BamStandardIndex::BAM_LIDX_SHIFT;
    const int endOffset = (alignmentStopPosition - 1) >> BamStandardIndex::BAM_LIDX_SHIFT;

    // resize vector if necessary
    int oldSize = offsets.size();
    int newSize = endOffset + 1;
    if (oldSize < newSize) offsets.resize(newSize, 0);

    // store offset
    for (int i = beginOffset + 1; i <= endOffset; ++i) {
        if (offsets[i] == 0) offsets[i] = lastOffset;
    }
}